

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3SchemaClear(void *p)

{
  Schema *pSVar1;
  Table *pTab;
  Schema *pSchema;
  HashElem *pElem;
  Hash temp2;
  Hash temp1;
  void *p_local;
  
  temp2.ht = *(_ht **)((long)p + 8);
  pSVar1 = *(Schema **)((long)p + 0x10);
  pElem = *(HashElem **)((long)p + 0x38);
  temp2._0_8_ = *(undefined8 *)((long)p + 0x40);
  temp2.first = *(HashElem **)((long)p + 0x48);
  sqlite3HashInit((Hash *)((long)p + 0x38));
  sqlite3HashClear((Hash *)((long)p + 0x20));
  for (pSchema = (Schema *)temp2._0_8_; pSchema != (Schema *)0x0; pSchema = *(Schema **)pSchema) {
    sqlite3DeleteTrigger((sqlite3 *)0x0,(Trigger *)(pSchema->tblHash).first);
  }
  sqlite3HashClear((Hash *)&pElem);
  sqlite3HashInit((Hash *)((long)p + 8));
  for (pSchema = pSVar1; pSchema != (Schema *)0x0; pSchema = *(Schema **)pSchema) {
    sqlite3DeleteTable((sqlite3 *)0x0,(Table *)(pSchema->tblHash).first);
  }
  sqlite3HashClear((Hash *)&temp2.ht);
  sqlite3HashClear((Hash *)((long)p + 0x50));
  *(undefined8 *)((long)p + 0x68) = 0;
  if ((*(ushort *)((long)p + 0x72) & 1) != 0) {
    *(int *)((long)p + 4) = *(int *)((long)p + 4) + 1;
  }
  *(ushort *)((long)p + 0x72) = *(ushort *)((long)p + 0x72) & 0xfff6;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3SchemaClear(void *p){
  Hash temp1;
  Hash temp2;
  HashElem *pElem;
  Schema *pSchema = (Schema *)p;

  temp1 = pSchema->tblHash;
  temp2 = pSchema->trigHash;
  sqlite3HashInit(&pSchema->trigHash);
  sqlite3HashClear(&pSchema->idxHash);
  for(pElem=sqliteHashFirst(&temp2); pElem; pElem=sqliteHashNext(pElem)){
    sqlite3DeleteTrigger(0, (Trigger*)sqliteHashData(pElem));
  }
  sqlite3HashClear(&temp2);
  sqlite3HashInit(&pSchema->tblHash);
  for(pElem=sqliteHashFirst(&temp1); pElem; pElem=sqliteHashNext(pElem)){
    Table *pTab = sqliteHashData(pElem);
    sqlite3DeleteTable(0, pTab);
  }
  sqlite3HashClear(&temp1);
  sqlite3HashClear(&pSchema->fkeyHash);
  pSchema->pSeqTab = 0;
  if( pSchema->schemaFlags & DB_SchemaLoaded ){
    pSchema->iGeneration++;
  }
  pSchema->schemaFlags &= ~(DB_SchemaLoaded|DB_ResetWanted);
}